

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall lzham::lzcompressor::compress_block(lzcompressor *this,void *pBuf,uint buf_len)

{
  bool bVar1;
  uint a;
  uint uVar2;
  uint in_EDX;
  long in_RDI;
  uint bytes_to_compress;
  uint bytes_remaining;
  uint cur_ofs;
  uint in_stack_0000015c;
  void *in_stack_00000160;
  lzcompressor *in_stack_00000168;
  uint local_24;
  
  local_24 = in_EDX;
  while( true ) {
    if (local_24 == 0) {
      return true;
    }
    a = search_accelerator::get_max_add_bytes((search_accelerator *)(in_RDI + 0x78));
    uVar2 = math::minimum<unsigned_int>(a,local_24);
    bVar1 = compress_block_internal(in_stack_00000168,in_stack_00000160,in_stack_0000015c);
    if (!bVar1) break;
    local_24 = local_24 - uVar2;
  }
  return false;
}

Assistant:

bool lzcompressor::compress_block(const void* pBuf, uint buf_len)
   {
      uint cur_ofs = 0;
      uint bytes_remaining = buf_len;
      while (bytes_remaining)
      {
         uint bytes_to_compress = math::minimum(m_accel.get_max_add_bytes(), bytes_remaining);
         if (!compress_block_internal(static_cast<const uint8*>(pBuf) + cur_ofs, bytes_to_compress))
         {
            LZHAM_LOG_ERROR(7046);
            return false;
         }

         cur_ofs += bytes_to_compress;
         bytes_remaining -= bytes_to_compress;
      }
      return true;
   }